

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abeta.hpp
# Opt level: O3

vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> * __thiscall
minimax::ABeta<uttt::IBoard,_minimax::Eval<uttt::IBoard>_>::operator()
          (vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
           *__return_storage_ptr__,ABeta<uttt::IBoard,_minimax::Eval<uttt::IBoard>_> *this,
          IBoard *game,int depth)

{
  pointer ppVar1;
  pointer ppVar2;
  long lVar3;
  pointer pfVar4;
  int iVar5;
  ulong uVar6;
  pointer this_00;
  vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
  futures;
  vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> r;
  vector<long,_std::allocator<long>_> moves;
  mutex mutex;
  vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
  local_d8;
  vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> local_b8;
  int local_a0;
  vector<long,_std::allocator<long>_> *local_98;
  undefined8 *local_90;
  future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_> local_80;
  vector<long,_std::allocator<long>_> local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (depth < 1) {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    uttt::IBoard::GetPossibleMoves(&local_70,game);
    local_d8.
    super__Vector_base<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.
    super__Vector_base<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_> *
         )0x0;
    local_d8.
    super__Vector_base<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_> *
         )0x0;
    iVar5 = std::thread::hardware_concurrency();
    local_38 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    if (0 < iVar5) {
      do {
        local_b8.
        super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)((game->micro)._M_elems + 6)
        ;
        local_b8.
        super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_start = *(pointer *)game;
        local_b8.
        super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = *(pointer *)((game->micro)._M_elems + 2);
        local_98 = &local_70;
        local_90 = &local_58;
        local_a0 = depth;
        std::operator()((launch)&local_80,(anon_class_48_4_9773dfe0_for__M_head_impl *)0x1);
        std::
        vector<std::future<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>,std::allocator<std::future<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>>>
        ::
        emplace_back<std::future<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>>
                  ((vector<std::future<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>,std::allocator<std::future<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>>>
                    *)&local_d8,&local_80);
        if (local_80.
            super___basic_future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
            ._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_80.
                     super___basic_future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                     ._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    pfVar4 = local_d8.
             super__Vector_base<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_d8.
        super__Vector_base<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.
        super__Vector_base<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = local_d8.
                super__Vector_base<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::
        future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>::
        get(&local_b8,this_00);
        std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::pair<long,double>*,std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>>
                  ((vector<std::pair<long,double>,std::allocator<std::pair<long,double>>> *)
                   __return_storage_ptr__,
                   (__return_storage_ptr__->
                   super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,
                   local_b8.
                   super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_b8.
                   super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        if (local_b8.
            super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.
                          super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        this_00 = this_00 + 1;
      } while (this_00 != pfVar4);
      ppVar1 = (__return_storage_ptr__->
               super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (__return_storage_ptr__->
               super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar1 != ppVar2) {
        uVar6 = (long)ppVar2 - (long)ppVar1 >> 4;
        lVar3 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::operator()(ppVar1,ppVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        std::operator()(ppVar1,ppVar2);
      }
    }
    std::
    vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
    ::~vector(&local_d8);
    if (local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_70.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<game::IMove, double>>
ABeta<IGame, Eval>::operator()(const IGame &game, int depth) const
{
    if (depth <= 0)
        return {};

    auto moves = game.GetPossibleMoves();
    std::vector<std::future<std::vector<std::pair<game::IMove, double>>>> futures;
    int num_threads = std::thread::hardware_concurrency();
    std::mutex mutex;

    for (int i = 0; i < num_threads; ++i)
        futures.emplace_back(std::async(std::launch::async, [game, depth, &moves, &mutex] {
            std::vector<std::pair<game::IMove, double>> results;
            while (true)
            {
                mutex.lock();
                if (moves.empty())
                {
                    mutex.unlock();
                    break;
                }
                game::IMove move = moves.back();
                moves.pop_back();
                mutex.unlock();
                IGame new_game(game);
                new_game.ApplyMove(move);
                results.emplace_back(move, -ABeta_<IGame, Eval>(new_game, depth - 1, -std::numeric_limits<double>::max(), std::numeric_limits<double>::max()));
            }
            return results;
        }));

    std::vector<std::pair<game::IMove, double>> results;
    for (auto &f : futures)
    {
        auto r = f.get();
        results.insert(std::end(results), std::begin(r), std::end(r));
    }

    std::sort(std::begin(results), std::end(results), [](const std::pair<game::IMove, double> &e1, const std::pair<game::IMove, double> &e2) {
        return e1.second > e2.second;
    });
    return results;
}